

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::validateSignalEventOwnership
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  ostream *poVar5;
  string local_60 [8];
  string previousActionOwner;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
  local_38;
  iterator actionIt;
  _Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false> local_28;
  iterator it;
  ze_event_handle_t hSignalEvent_local;
  string *zeCallDisc_local;
  ZEeventsChecker *this_local;
  
  it.super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>)
       (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>)hSignalEvent;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
       ::find(&this->eventToDagID,(key_type *)&it);
  actionIt.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false>
             )std::
              unordered_map<_ze_event_handle_t_*,_unsigned_int,_std::hash<_ze_event_handle_t_*>,_std::equal_to<_ze_event_handle_t_*>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>_>
              ::end(&this->eventToDagID);
  bVar1 = std::__detail::operator!=
                    (&local_28,
                     (_Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                      *)&actionIt);
  bVar2 = false;
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                         *)&local_28);
    bVar2 = ppVar3->second != 0xffffffff;
  }
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false,_false>
                         *)&local_28);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>_>
         ::find(&this->dagIDToAction,&ppVar3->second);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>_>
         ::end(&this->dagIDToAction);
    bVar2 = std::__detail::operator!=(&local_38,&local_40);
    if (bVar2) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_false,_false>
                             *)&local_38);
      std::__cxx11::string::string(local_60,(string *)&ppVar4->second);
      poVar5 = std::operator<<((ostream *)&std::cerr,"Warning: ");
      poVar5 = std::operator<<(poVar5,(string *)zeCallDisc);
      poVar5 = std::operator<<(poVar5," is using the same ze_event_handle_t for signal {");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,(void *)it.
                                         super__Node_iterator_base<std::pair<_ze_event_handle_t_*const,_unsigned_int>,_false>
                                         ._M_cur);
      poVar5 = std::operator<<(poVar5,"} which has been previously used by: ");
      poVar5 = std::operator<<(poVar5,local_60);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_60);
    }
  }
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::validateSignalEventOwnership(const std::string &zeCallDisc,
                                                                  const ze_event_handle_t hSignalEvent) {
    const auto it = eventToDagID.find(hSignalEvent);
    if (it != eventToDagID.end() && it->second != invalidDagID) {
        const auto actionIt = dagIDToAction.find(it->second);
        if (actionIt != dagIDToAction.end()) {
            const std::string previousActionOwner = actionIt->second.first;
            std::cerr << "Warning: " << zeCallDisc << " is using the same ze_event_handle_t for signal {" << hSignalEvent << "} which has been previously used by: " << previousActionOwner << std::endl;
        }
    }
}